

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceIntersectorK<4>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  uint uVar5;
  AccelData *pAVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar18;
  byte bVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  byte bVar23;
  byte bVar24;
  ulong uVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  size_t sVar30;
  Primitive *prim;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar31;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_ZMM0 [64];
  vint4 bi;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  vint4 bi_1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  vint4 ai;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined4 uVar74;
  vint4 bi_3;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 bi_5;
  undefined1 auVar78 [16];
  vint4 ai_4;
  undefined1 auVar79 [64];
  vint4 bi_4;
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  int in_XMM14_Da;
  int in_XMM14_Db;
  int in_XMM14_Dc;
  int in_XMM14_Dd;
  undefined1 auVar88 [64];
  int in_XMM15_Da;
  int in_XMM15_Db;
  int in_XMM15_Dc;
  int in_XMM15_Dd;
  undefined1 auVar89 [64];
  int in_XMM16_Da;
  int in_XMM16_Db;
  int in_XMM16_Dc;
  int in_XMM16_Dd;
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  vbool<4>_conflict valid0;
  InstanceIntersectorK<4> local_1189;
  undefined4 local_1188;
  Precalculations pre;
  uint local_1180;
  uint local_1138 [4];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  uint local_10b8;
  uint uStack_10b4;
  uint uStack_10b0;
  uint uStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar43 [16];
  
  auVar43 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  uVar35 = vpcmpeqd_avx512vl(auVar43,(undefined1  [16])valid_i->field_0);
  uVar35 = uVar35 & 0xf;
  bVar24 = (byte)uVar35;
  if (bVar24 == 0) {
    return;
  }
  pAVar6 = This->ptr;
  local_10e8 = *(undefined1 (*) [16])ray;
  auVar81 = ZEXT1664(local_10e8);
  local_10f8 = *(undefined1 (*) [16])(ray + 0x10);
  auVar82 = ZEXT1664(local_10f8);
  local_1108 = *(undefined1 (*) [16])(ray + 0x20);
  auVar83 = ZEXT1664(local_1108);
  auVar42 = *(undefined1 (*) [16])(ray + 0x40);
  auVar40._8_4_ = 0x7fffffff;
  auVar40._0_8_ = 0x7fffffff7fffffff;
  auVar40._12_4_ = 0x7fffffff;
  auVar75._8_4_ = 0x219392ef;
  auVar75._0_8_ = 0x219392ef219392ef;
  auVar75._12_4_ = 0x219392ef;
  auVar37 = vandps_avx(auVar42,auVar40);
  uVar36 = vcmpps_avx512vl(auVar37,auVar75,1);
  auVar37 = vblendmps_avx512vl(auVar42,auVar75);
  bVar7 = (bool)((byte)uVar36 & 1);
  auVar41._0_4_ = (uint)bVar7 * auVar37._0_4_ | (uint)!bVar7 * in_XMM14_Da;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * in_XMM14_Db;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar7 * auVar37._8_4_ | (uint)!bVar7 * in_XMM14_Dc;
  bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar7 * auVar37._12_4_ | (uint)!bVar7 * in_XMM14_Dd;
  auVar37 = *(undefined1 (*) [16])(ray + 0x50);
  auVar38 = vandps_avx(auVar37,auVar40);
  uVar36 = vcmpps_avx512vl(auVar38,auVar75,1);
  auVar38 = vblendmps_avx512vl(auVar37,auVar75);
  bVar7 = (bool)((byte)uVar36 & 1);
  auVar57._0_4_ = (uint)bVar7 * auVar38._0_4_ | (uint)!bVar7 * in_XMM15_Da;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * in_XMM15_Db;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * in_XMM15_Dc;
  bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * in_XMM15_Dd;
  auVar38 = *(undefined1 (*) [16])(ray + 0x60);
  auVar79 = ZEXT1664(auVar38);
  auVar39 = vandps_avx(auVar38,auVar40);
  uVar36 = vcmpps_avx512vl(auVar39,auVar75,1);
  auVar39 = vblendmps_avx512vl(auVar38,auVar75);
  bVar7 = (bool)((byte)uVar36 & 1);
  auVar59._0_4_ = (uint)bVar7 * auVar39._0_4_ | (uint)!bVar7 * in_XMM16_Da;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar7 * auVar39._4_4_ | (uint)!bVar7 * in_XMM16_Db;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar7 * auVar39._8_4_ | (uint)!bVar7 * in_XMM16_Dc;
  bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar7 * auVar39._12_4_ | (uint)!bVar7 * in_XMM16_Dd;
  auVar40 = vrcp14ps_avx512vl(auVar41);
  auVar75 = ZEXT816(0) << 0x40;
  auVar84 = ZEXT1664(auVar75);
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = 0x3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  auVar39 = vfnmadd213ps_fma(auVar41,auVar40,auVar76);
  local_1068 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  auVar88 = ZEXT1664(local_1068);
  auVar41 = vrcp14ps_avx512vl(auVar57);
  auVar39 = vfnmadd213ps_fma(auVar57,auVar41,auVar76);
  local_1078 = vfmadd132ps_fma(auVar39,auVar41,auVar41);
  auVar89 = ZEXT1664(local_1078);
  auVar39 = vrcp14ps_avx512vl(auVar59);
  auVar41 = vfnmadd213ps_avx512vl(auVar59,auVar39,auVar76);
  local_1088 = vfmadd132ps_avx512vl(auVar41,auVar39,auVar39);
  auVar90 = ZEXT1664(local_1088);
  local_1118 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar75);
  local_1128 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar75);
  uVar25 = uVar35 ^ 0xf;
  auVar42 = vcmpps_avx(auVar42,auVar75,1);
  auVar39._8_4_ = 1;
  auVar39._0_8_ = 0x100000001;
  auVar39._12_4_ = 1;
  auVar39 = vandps_avx512vl(auVar42,auVar39);
  auVar72._8_4_ = 2;
  auVar72._0_8_ = 0x200000002;
  auVar72._12_4_ = 2;
  uVar36 = vcmpps_avx512vl(auVar37,auVar75,1);
  auVar42 = vpsubd_avx512vl(auVar72,auVar42);
  bVar7 = (bool)((byte)uVar36 & 1);
  auVar37._0_4_ = (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar39._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar37._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar39._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar37._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar39._8_4_;
  bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar37._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar39._12_4_;
  uVar36 = vcmpps_avx512vl(auVar38,auVar75,1);
  auVar42._8_4_ = 4;
  auVar42._0_8_ = 0x400000004;
  auVar42._12_4_ = 4;
  auVar42 = vpord_avx512vl(auVar37,auVar42);
  bVar7 = (bool)((byte)uVar36 & 1);
  auVar38._0_4_ = (uint)bVar7 * auVar42._0_4_ | !bVar7 * auVar37._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar7 * auVar42._4_4_ | !bVar7 * auVar37._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar7 * auVar42._8_4_ | !bVar7 * auVar37._8_4_;
  bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar7 * auVar42._12_4_ | !bVar7 * auVar37._12_4_;
  auVar71 = ZEXT1664(auVar38);
  auVar42 = vmovdqa32_avx512vl(auVar38);
  bVar7 = (bool)((byte)(uVar35 >> 1) & 1);
  bVar8 = (bool)((byte)(uVar35 >> 2) & 1);
  bVar11 = SUB81(uVar35 >> 3,0);
  local_1138[0] = (uint)(bVar24 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar43._0_4_;
  local_1138[1] = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar43._4_4_;
  local_1138[2] = (uint)bVar8 * auVar42._8_4_ | (uint)!bVar8 * auVar43._8_4_;
  local_1138[3] = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar43._12_4_;
  auVar68 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
  local_10c8 = local_1068._0_4_ * -local_10e8._0_4_;
  fStack_10c4 = local_1068._4_4_ * -local_10e8._4_4_;
  fStack_10c0 = local_1068._8_4_ * -local_10e8._8_4_;
  fStack_10bc = local_1068._12_4_ * -local_10e8._12_4_;
  local_10d8 = local_1078._0_4_ * -local_10f8._0_4_;
  fStack_10d4 = local_1078._4_4_ * -local_10f8._4_4_;
  fStack_10d0 = local_1078._8_4_ * -local_10f8._8_4_;
  fStack_10cc = local_1078._12_4_ * -local_10f8._12_4_;
  auVar43._0_8_ = local_1108._0_8_ ^ 0x8000000080000000;
  auVar43._8_4_ = local_1108._8_4_ ^ 0x80000000;
  auVar43._12_4_ = local_1108._12_4_ ^ 0x80000000;
  local_1098 = vmulps_avx512vl(local_1088,auVar43);
  auVar92 = ZEXT1664(local_1098);
LAB_01cea074:
  lVar20 = 0;
  for (uVar36 = uVar35; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
    lVar20 = lVar20 + 1;
  }
  uVar5 = local_1138[lVar20];
  auVar61._4_4_ = uVar5;
  auVar61._0_4_ = uVar5;
  auVar61._8_4_ = uVar5;
  auVar61._12_4_ = uVar5;
  auVar14._4_4_ = local_1138[1];
  auVar14._0_4_ = local_1138[0];
  auVar14._8_4_ = local_1138[2];
  auVar14._12_4_ = local_1138[3];
  uVar36 = vpcmpeqd_avx512vl(auVar61,auVar14);
  uVar36 = uVar36 & 0xf;
  bVar19 = (byte)uVar36;
  stack[0].mask = CONCAT44((int)((ulong)lVar20 >> 0x20),(uint)bVar19);
  auVar85._8_4_ = 0x7f800000;
  auVar85._0_8_ = 0x7f8000007f800000;
  auVar85._12_4_ = 0x7f800000;
  auVar43 = vblendmps_avx512vl(auVar85,local_10e8);
  auVar44._0_4_ = (uint)(bVar19 & 1) * auVar43._0_4_ | !(bool)(bVar19 & 1) * uVar5;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar7 * auVar43._4_4_ | !bVar7 * uVar5;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar7 * auVar43._8_4_ | !bVar7 * uVar5;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar44._12_4_ = (uint)bVar7 * auVar43._12_4_ | !bVar7 * uVar5;
  auVar43 = vblendmps_avx512vl(auVar85,local_10f8);
  auVar45._0_4_ = (uint)(bVar19 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar68._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar68._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * auVar68._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar45._12_4_ = (uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * auVar68._12_4_;
  auVar43 = vblendmps_avx512vl(auVar85,local_1108);
  auVar46._0_4_ = (uint)(bVar19 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar71._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar71._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * auVar71._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar46._12_4_ = (uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * auVar71._12_4_;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar42 = vblendmps_avx512vl(auVar43,local_10e8);
  auVar47._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * local_10e8._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * local_10e8._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * local_10e8._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar47._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * local_10e8._12_4_;
  auVar42 = vblendmps_avx512vl(auVar43,local_10f8);
  auVar48._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * local_10f8._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * local_10f8._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * local_10f8._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar48._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * local_10f8._12_4_;
  auVar42 = vblendmps_avx512vl(auVar43,local_1108);
  auVar49._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * local_1108._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * local_1108._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * local_1108._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar49._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * local_1108._12_4_;
  auVar42 = vblendmps_avx512vl(auVar85,auVar88._0_16_);
  auVar50._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar79._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar79._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar79._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar50._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar79._12_4_;
  auVar42 = vblendmps_avx512vl(auVar85,auVar89._0_16_);
  auVar51._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar81._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar81._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar81._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar51._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar81._12_4_;
  auVar42 = vblendmps_avx512vl(auVar85,auVar90._0_16_);
  auVar52._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar82._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar82._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar82._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar52._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar82._12_4_;
  auVar42 = vblendmps_avx512vl(auVar43,auVar88._0_16_);
  auVar53._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar83._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar53._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar83._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar53._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar83._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar53._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar83._12_4_;
  auVar42 = vblendmps_avx512vl(auVar43,auVar89._0_16_);
  auVar54._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar84._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar54._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar84._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar54._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar84._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar54._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar84._12_4_;
  auVar42 = vblendmps_avx512vl(auVar43,auVar90._0_16_);
  auVar55._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM11._0_4_;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar55._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * in_ZMM11._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar55._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * in_ZMM11._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar55._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * in_ZMM11._12_4_;
  auVar42 = vblendmps_avx512vl(auVar85,local_1118);
  auVar56._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * 0x7f800000;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * 0x7f800000;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * 0x7f800000;
  bVar7 = SUB81(uVar36 >> 3,0);
  auVar56._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * 0x7f800000;
  auVar43 = vblendmps_avx512vl(auVar43,local_1128);
  local_10a8._0_4_ = (uint)(bVar19 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM19._0_4_
  ;
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  local_10a8._4_4_ = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * in_ZMM19._4_4_;
  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
  local_10a8._8_4_ = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * in_ZMM19._8_4_;
  bVar7 = SUB81(uVar36 >> 3,0);
  local_10a8._12_4_ = (uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * in_ZMM19._12_4_;
  auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x7f800000));
  auVar43 = vpblendmd_avx512vl(auVar43,local_1118);
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  bVar8 = (bool)((byte)(uVar36 >> 2) & 1);
  bVar11 = SUB81(uVar36 >> 3,0);
  local_10b8 = (uint)(bVar19 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar19 & 1) * local_1118._0_4_;
  uStack_10b4 = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * local_1118._4_4_;
  uStack_10b0 = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * local_1118._8_4_;
  uStack_10ac = (uint)bVar11 * auVar43._12_4_ | (uint)!bVar11 * local_1118._12_4_;
  local_1180 = (uint)uVar36;
  uVar35 = ~stack[0].mask & uVar35;
  auVar43 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar42 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vminps_avx(auVar42,auVar43);
  auVar42 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar42 = vminps_avx(auVar42,auVar45);
  auVar37 = vshufpd_avx(auVar42,auVar42,1);
  auVar42 = vminps_avx(auVar37,auVar42);
  auVar43 = vinsertps_avx(auVar43,auVar42,0x1c);
  auVar42 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar42 = vminps_avx(auVar42,auVar46);
  auVar37 = vshufpd_avx(auVar42,auVar42,1);
  auVar42 = vminps_avx(auVar37,auVar42);
  auVar43 = vinsertps_avx(auVar43,auVar42,0x20);
  auVar42 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar42 = vmaxps_avx(auVar42,auVar47);
  auVar37 = vshufpd_avx(auVar42,auVar42,1);
  auVar42 = vmaxps_avx(auVar37,auVar42);
  auVar37 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar37 = vmaxps_avx(auVar37,auVar48);
  auVar38 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vmaxps_avx(auVar38,auVar37);
  auVar42 = vinsertps_avx(auVar42,auVar37,0x1c);
  auVar37 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar37 = vmaxps_avx(auVar37,auVar49);
  auVar38 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vmaxps_avx(auVar38,auVar37);
  auVar42 = vinsertps_avx(auVar42,auVar37,0x20);
  auVar37 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar37 = vminps_avx(auVar37,auVar50);
  auVar38 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vminps_avx(auVar38,auVar37);
  auVar38 = vshufps_avx(auVar51,auVar51,0xb1);
  auVar38 = vminps_avx(auVar38,auVar51);
  auVar39 = vshufpd_avx(auVar38,auVar38,1);
  auVar38 = vminps_avx(auVar39,auVar38);
  auVar37 = vinsertps_avx(auVar37,auVar38,0x1c);
  auVar38 = vshufps_avx(auVar52,auVar52,0xb1);
  auVar38 = vminps_avx(auVar38,auVar52);
  auVar39 = vshufpd_avx(auVar38,auVar38,1);
  auVar38 = vminps_avx(auVar39,auVar38);
  auVar37 = vinsertps_avx(auVar37,auVar38,0x20);
  auVar38 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar38 = vmaxps_avx(auVar38,auVar53);
  auVar39 = vshufpd_avx(auVar38,auVar38,1);
  auVar38 = vmaxps_avx(auVar39,auVar38);
  auVar39 = vshufps_avx(auVar54,auVar54,0xb1);
  auVar39 = vmaxps_avx(auVar39,auVar54);
  auVar41 = vshufpd_avx(auVar39,auVar39,1);
  auVar39 = vmaxps_avx(auVar41,auVar39);
  auVar38 = vinsertps_avx(auVar38,auVar39,0x1c);
  auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar39 = vmaxps_avx(auVar39,auVar55);
  auVar41 = vshufpd_avx(auVar39,auVar39,1);
  auVar39 = vmaxps_avx(auVar41,auVar39);
  auVar38 = vinsertps_avx(auVar38,auVar39,0x20);
  auVar39 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar39 = vminps_avx(auVar39,auVar56);
  auVar41 = vshufps_avx512vl(local_10a8,local_10a8,0xb1);
  auVar57 = vmaxps_avx512vl(auVar41,local_10a8);
  uVar36 = vcmpps_avx512vl(auVar37,ZEXT416(0) << 0x20,5);
  auVar41 = vblendmps_avx512vl(auVar38,auVar37);
  bVar19 = (byte)uVar36;
  fVar1 = (float)((uint)(bVar19 & 1) * auVar41._0_4_);
  fVar2 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar41._4_4_);
  auVar58._4_4_ = fVar2;
  auVar58._0_4_ = fVar1;
  fVar3 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar41._8_4_);
  auVar58._8_4_ = fVar3;
  fVar4 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar41._12_4_);
  auVar58._12_4_ = fVar4;
  auVar79 = ZEXT1664(auVar58);
  auVar59 = vblendmps_avx512vl(auVar43,auVar42);
  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
  bVar9 = (bool)((byte)(uVar36 >> 2) & 1);
  bVar12 = (bool)((byte)(uVar36 >> 3) & 1);
  bVar8 = (bool)((byte)(uVar36 >> 1) & 1);
  bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
  bVar13 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar41 = vmovshdup_avx(auVar58);
  uVar33 = (ulong)(auVar41._0_4_ < 0.0) << 4 | 0x20;
  auVar41 = vshufpd_avx(auVar58,auVar58,1);
  uVar22 = (ulong)(auVar41._0_4_ < 0.0) << 4 | 0x40;
  auVar60._0_4_ =
       (float)((uint)(bVar19 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar37._0_4_);
  bVar11 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar60._4_4_ = (float)((uint)bVar11 * auVar38._4_4_ | (uint)!bVar11 * auVar37._4_4_);
  bVar11 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar60._8_4_ = (float)((uint)bVar11 * auVar38._8_4_ | (uint)!bVar11 * auVar37._8_4_);
  bVar11 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar60._12_4_ = (float)((uint)bVar11 * auVar38._12_4_ | (uint)!bVar11 * auVar37._12_4_);
  auVar63._0_4_ =
       (float)((uint)(bVar19 & 1) * auVar59._0_4_ | !(bool)(bVar19 & 1) * auVar51._0_4_) * fVar1;
  auVar63._4_4_ = (float)((uint)bVar7 * auVar59._4_4_ | !bVar7 * auVar51._4_4_) * fVar2;
  auVar63._8_4_ = (float)((uint)bVar9 * auVar59._8_4_ | !bVar9 * auVar51._8_4_) * fVar3;
  auVar63._12_4_ = (float)((uint)bVar12 * auVar59._12_4_ | !bVar12 * auVar51._12_4_) * fVar4;
  auVar69._0_4_ =
       (float)((uint)(bVar19 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar42._0_4_) *
       auVar60._0_4_;
  auVar69._4_4_ =
       (float)((uint)bVar8 * auVar43._4_4_ | (uint)!bVar8 * auVar42._4_4_) * auVar60._4_4_;
  auVar69._8_4_ =
       (float)((uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar42._8_4_) * auVar60._8_4_;
  auVar69._12_4_ =
       (float)((uint)bVar13 * auVar43._12_4_ | (uint)!bVar13 * auVar42._12_4_) * auVar60._12_4_;
  auVar71 = ZEXT1664(auVar69);
  uVar21 = (ulong)(fVar1 < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar6[1].bounds.bounds0.lower.field_0;
  local_f88._4_4_ = fVar1;
  local_f88._0_4_ = fVar1;
  local_f88._8_4_ = fVar1;
  local_f88._12_4_ = fVar1;
  in_ZMM11 = ZEXT1664(local_f88);
  auVar80._8_4_ = 0x80000000;
  auVar80._0_8_ = 0x8000000080000000;
  auVar80._12_4_ = 0x80000000;
  auVar81 = ZEXT1664(auVar80);
  uVar36 = CONCAT44(auVar63._0_4_,auVar63._0_4_);
  local_f98._0_8_ = uVar36 ^ 0x8000000080000000;
  local_f98._8_4_ = -auVar63._0_4_;
  local_f98._12_4_ = -auVar63._0_4_;
  auVar86 = ZEXT1664(local_f98);
  local_fa8 = vshufps_avx(auVar58,auVar58,0x55);
  auVar87 = ZEXT1664(local_fa8);
  auVar43 = vshufps_avx(auVar63,auVar63,0x55);
  local_fb8 = vxorps_avx512vl(auVar43,auVar80);
  auVar91 = ZEXT1664(local_fb8);
  local_fc8 = vshufps_avx512vl(auVar58,auVar58,0xaa);
  auVar93 = ZEXT1664(local_fc8);
  auVar43 = vshufps_avx(auVar63,auVar63,0xaa);
  local_fd8 = vxorps_avx512vl(auVar43,auVar80);
  auVar94 = ZEXT1664(local_fd8);
  local_fe8 = vbroadcastss_avx512vl(auVar60);
  auVar95 = ZEXT1664(local_fe8);
  auVar64._4_4_ = auVar69._0_4_;
  auVar64._0_4_ = auVar69._0_4_;
  auVar64._8_4_ = auVar69._0_4_;
  auVar64._12_4_ = auVar69._0_4_;
  local_ff8 = vxorps_avx512vl(auVar64,auVar80);
  auVar96 = ZEXT1664(local_ff8);
  local_1008 = vshufps_avx512vl(auVar60,auVar60,0x55);
  auVar97 = ZEXT1664(local_1008);
  uVar74 = auVar39._0_4_;
  auVar65._4_4_ = uVar74;
  auVar65._0_4_ = uVar74;
  auVar65._8_4_ = uVar74;
  auVar65._12_4_ = uVar74;
  auVar43 = vshufps_avx(auVar39,auVar39,0xaa);
  local_1018 = vminps_avx512vl(auVar43,auVar65);
  auVar98 = ZEXT1664(local_1018);
  uVar74 = auVar57._0_4_;
  auVar66._4_4_ = uVar74;
  auVar66._0_4_ = uVar74;
  auVar66._8_4_ = uVar74;
  auVar66._12_4_ = uVar74;
  auVar43 = vshufps_avx(auVar57,auVar57,0xaa);
  local_1028 = vmaxps_avx512vl(auVar43,auVar66);
  auVar99 = ZEXT1664(local_1028);
  auVar43 = vshufps_avx(auVar69,auVar69,0x55);
  auVar68 = ZEXT1664(auVar43);
  local_1038 = vxorps_avx512vl(auVar43,auVar80);
  auVar100 = ZEXT1664(local_1038);
  local_1048 = vshufps_avx512vl(auVar60,auVar60,0xaa);
  auVar101 = ZEXT1664(local_1048);
  auVar43 = vshufps_avx(auVar69,auVar69,0xaa);
  local_1058 = vxorps_avx512vl(auVar43,auVar80);
  auVar102 = ZEXT1664(local_1058);
  pSVar32 = stack + 1;
LAB_01cea40e:
  in_ZMM19 = ZEXT1664(local_10a8);
  local_1188 = (undefined4)uVar25;
  auVar16._4_4_ = fStack_10c4;
  auVar16._0_4_ = local_10c8;
  auVar16._8_4_ = fStack_10c0;
  auVar16._12_4_ = fStack_10bc;
  auVar82 = ZEXT1664(auVar16);
  auVar15._4_4_ = fStack_10d4;
  auVar15._0_4_ = local_10d8;
  auVar15._8_4_ = fStack_10d0;
  auVar15._12_4_ = fStack_10cc;
  auVar83 = ZEXT1664(auVar15);
  auVar17._4_4_ = uStack_10b4;
  auVar17._0_4_ = local_10b8;
  auVar17._8_4_ = uStack_10b0;
  auVar17._12_4_ = uStack_10ac;
  auVar84 = ZEXT1664(auVar17);
  pSVar31 = pSVar32;
  do {
    if (pSVar31 == stack) goto LAB_01cea737;
    pSVar32 = pSVar31 + -1;
    pSVar18 = pSVar31 + -1;
    pSVar31 = pSVar32;
    if ((pSVar18->mask & ~(uVar25 & 0xff)) != 0) {
      sVar29 = 1;
      sVar30 = (pSVar32->ptr).ptr;
      do {
        pSVar31 = pSVar32;
        if ((sVar30 & 8) != 0) {
          if (sVar29 != 0) {
            valid0.v = ~(byte)uVar25 & 0xf;
            lVar20 = (ulong)((uint)sVar30 & 0xf) - 7;
            prim = (Primitive *)(sVar30 & 0xfffffffffffffff0);
            goto LAB_01cea603;
          }
          break;
        }
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar30 + 0x20 + uVar21),auVar86._0_16_,
                                  in_ZMM11._0_16_);
        auVar42 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(sVar30 + 0x20 + uVar33),auVar91._0_16_,
                             auVar87._0_16_);
        auVar43 = vpmaxsd_avx(auVar43,auVar42);
        auVar42 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(sVar30 + 0x20 + uVar22),auVar94._0_16_,
                             auVar93._0_16_);
        auVar42 = vpmaxsd_avx512vl(auVar42,auVar98._0_16_);
        auVar43 = vpmaxsd_avx(auVar43,auVar42);
        auVar42 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(sVar30 + 0x20 + (uVar21 ^ 0x10)),auVar96._0_16_,
                             auVar95._0_16_);
        auVar37 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(sVar30 + 0x20 + (uVar33 ^ 0x10)),auVar100._0_16_
                             ,auVar97._0_16_);
        auVar42 = vpminsd_avx(auVar42,auVar37);
        auVar37 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(sVar30 + 0x20 + (uVar22 ^ 0x10)),auVar102._0_16_
                             ,auVar101._0_16_);
        auVar37 = vpminsd_avx512vl(auVar37,auVar99._0_16_);
        auVar71 = ZEXT1664(auVar37);
        auVar42 = vpminsd_avx(auVar42,auVar37);
        auVar68 = ZEXT1664(auVar42);
        uVar36 = vcmpps_avx512vl(auVar43,auVar42,2);
        if ((char)uVar36 == '\0') break;
        sVar26 = 8;
        sVar28 = 0;
        do {
          lVar20 = 0;
          for (uVar34 = uVar36; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar74 = *(undefined4 *)(sVar30 + 0x20 + lVar20 * 4);
          auVar62._4_4_ = uVar74;
          auVar62._0_4_ = uVar74;
          auVar62._8_4_ = uVar74;
          auVar62._12_4_ = uVar74;
          auVar37 = vfmadd132ps_fma(auVar62,auVar16,auVar88._0_16_);
          uVar74 = *(undefined4 *)(sVar30 + 0x40 + lVar20 * 4);
          auVar67._4_4_ = uVar74;
          auVar67._0_4_ = uVar74;
          auVar67._8_4_ = uVar74;
          auVar67._12_4_ = uVar74;
          auVar38 = vfmadd132ps_fma(auVar67,auVar15,auVar89._0_16_);
          uVar74 = *(undefined4 *)(sVar30 + 0x60 + lVar20 * 4);
          auVar70._4_4_ = uVar74;
          auVar70._0_4_ = uVar74;
          auVar70._8_4_ = uVar74;
          auVar70._12_4_ = uVar74;
          auVar57 = vfmadd132ps_avx512vl(auVar70,auVar92._0_16_,auVar90._0_16_);
          auVar71 = ZEXT1664(auVar57);
          uVar74 = *(undefined4 *)(sVar30 + 0x30 + lVar20 * 4);
          auVar73._4_4_ = uVar74;
          auVar73._0_4_ = uVar74;
          auVar73._8_4_ = uVar74;
          auVar73._12_4_ = uVar74;
          auVar39 = vfmadd132ps_fma(auVar73,auVar16,auVar88._0_16_);
          uVar74 = *(undefined4 *)(sVar30 + 0x50 + lVar20 * 4);
          auVar77._4_4_ = uVar74;
          auVar77._0_4_ = uVar74;
          auVar77._8_4_ = uVar74;
          auVar77._12_4_ = uVar74;
          auVar41 = vfmadd132ps_fma(auVar77,auVar15,auVar89._0_16_);
          uVar74 = *(undefined4 *)(sVar30 + 0x70 + lVar20 * 4);
          auVar78._4_4_ = uVar74;
          auVar78._0_4_ = uVar74;
          auVar78._8_4_ = uVar74;
          auVar78._12_4_ = uVar74;
          auVar59 = vfmadd132ps_avx512vl(auVar78,auVar92._0_16_,auVar90._0_16_);
          auVar43 = vpminsd_avx(auVar37,auVar39);
          auVar42 = vpminsd_avx(auVar38,auVar41);
          auVar43 = vpmaxsd_avx(auVar43,auVar42);
          auVar42 = vpminsd_avx(auVar57,auVar59);
          auVar42 = vpmaxsd_avx(auVar42,auVar17);
          auVar81 = ZEXT1664(auVar42);
          auVar43 = vpmaxsd_avx(auVar43,auVar42);
          auVar79 = ZEXT1664(auVar43);
          auVar42 = vpmaxsd_avx(auVar37,auVar39);
          auVar37 = vpmaxsd_avx(auVar38,auVar41);
          auVar37 = vpminsd_avx(auVar42,auVar37);
          auVar42 = vpmaxsd_avx(auVar57,auVar59);
          auVar42 = vpminsd_avx512vl(auVar42,local_10a8);
          auVar68 = ZEXT1664(auVar42);
          auVar42 = vpminsd_avx(auVar37,auVar42);
          uVar34 = vpcmpd_avx512vl(auVar43,auVar42,2);
          uVar34 = uVar34 & 0xf;
          sVar27 = sVar26;
          sVar29 = sVar28;
          if (((char)uVar34 != '\0') &&
             (sVar27 = *(size_t *)(sVar30 + lVar20 * 8), sVar29 = uVar34, sVar26 != 8)) {
            (pSVar32->ptr).ptr = sVar26;
            pSVar32->mask = sVar28;
            pSVar32 = pSVar32 + 1;
          }
          uVar36 = uVar36 - 1 & uVar36;
          sVar26 = sVar27;
          sVar28 = sVar29;
        } while (uVar36 != 0);
        sVar30 = sVar27;
        pSVar31 = pSVar32;
      } while (sVar27 != 8);
    }
  } while( true );
  while( true ) {
    InstanceIntersectorK<4>::occluded(&local_1189,&valid0,&pre,ray,context,prim);
    auVar102 = ZEXT1664(local_1058);
    auVar101 = ZEXT1664(local_1048);
    auVar100 = ZEXT1664(local_1038);
    auVar99 = ZEXT1664(local_1028);
    auVar98 = ZEXT1664(local_1018);
    auVar97 = ZEXT1664(local_1008);
    auVar96 = ZEXT1664(local_ff8);
    auVar95 = ZEXT1664(local_fe8);
    auVar94 = ZEXT1664(local_fd8);
    auVar93 = ZEXT1664(local_fc8);
    auVar91 = ZEXT1664(local_fb8);
    auVar87 = ZEXT1664(local_fa8);
    auVar86 = ZEXT1664(local_f98);
    in_ZMM11 = ZEXT1664(local_f88);
    auVar92 = ZEXT1664(local_1098);
    auVar90 = ZEXT1664(local_1088);
    auVar89 = ZEXT1664(local_1078);
    auVar88 = ZEXT1664(local_1068);
    valid0.v = ~(byte)local_1189 & valid0.v & 0xf;
    prim = prim + 1;
    if (valid0.v == 0) break;
LAB_01cea603:
    lVar20 = lVar20 + -1;
    if (lVar20 == 0) goto LAB_01cea6ef;
  }
  valid0.v = 0;
LAB_01cea6ef:
  bVar23 = (byte)local_1188 | valid0.v ^ 0xf;
  uVar5 = CONCAT31((int3)((uint)local_1188 >> 8),bVar23);
  uVar25 = (ulong)uVar5;
  bVar19 = (byte)local_1180 & ~bVar23;
  local_1180 = (uint)bVar19;
  if (bVar19 == 0) goto LAB_01cea737;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_10a8._0_4_ =
       (uint)(bVar23 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar23 & 1) * local_10a8._0_4_;
  bVar7 = (bool)((byte)(uVar5 >> 1) & 1);
  local_10a8._4_4_ = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * local_10a8._4_4_;
  bVar7 = (bool)((byte)(uVar5 >> 2) & 1);
  local_10a8._8_4_ = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * local_10a8._8_4_;
  bVar7 = (bool)((byte)(uVar5 >> 3) & 1);
  local_10a8._12_4_ = (uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * local_10a8._12_4_;
  goto LAB_01cea40e;
LAB_01cea737:
  if (uVar35 == 0) {
    bVar24 = (byte)uVar25 & bVar24;
    bVar7 = (bool)(bVar24 >> 1 & 1);
    bVar8 = (bool)(bVar24 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar24 & 1) * -0x800000 | (uint)!(bool)(bVar24 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar24 >> 3) * -0x800000 | (uint)!(bool)(bVar24 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_01cea074;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }